

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O0

void __thiscall
(anonymous_namespace)::KeyFrameIntervalTestLarge::HandleDecodeResult
          (KeyFrameIntervalTestLarge *this)

{
  Decoder *in_stack_00000070;
  aom_codec_err_t in_stack_0000007c;
  KeyFrameIntervalTestLarge *in_stack_00000080;
  
  anon_unknown.dwarf_46c44b::KeyFrameIntervalTestLarge::HandleDecodeResult
            (in_stack_00000080,in_stack_0000007c,in_stack_00000070);
  return;
}

Assistant:

bool HandleDecodeResult(const aom_codec_err_t res_dec,
                          libaom_test::Decoder *decoder) override {
    EXPECT_EQ(AOM_CODEC_OK, res_dec) << decoder->DecodeError();
    if (AOM_CODEC_OK == res_dec) {
      aom_codec_ctx_t *ctx_dec = decoder->GetDecoder();
      int frame_flags = 0;
      AOM_CODEC_CONTROL_TYPECHECKED(ctx_dec, AOMD_GET_FRAME_FLAGS,
                                    &frame_flags);
      if (kf_dist_ != -1) {
        kf_dist_++;
        if (kf_dist_ > (int)kf_dist_param_.max_kf_dist) {
          is_kf_interval_violated_ = true;
        }
      }
      if ((frame_flags & AOM_FRAME_IS_KEY) == AOM_FRAME_IS_KEY) {
        if (kf_dist_ != -1 && kf_dist_ < (int)kf_dist_param_.min_kf_dist) {
          is_kf_interval_violated_ = true;
        }
        kf_dist_ = 0;
      }
    }
    return AOM_CODEC_OK == res_dec;
  }